

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_aa32_st_i64(DisasContext_conflict1 *s,TCGv_i64 val,TCGv_i32 a32,int index,MemOp opc)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i64 addr_00;
  TCGv_i64 ret;
  TCGv_i64 tmp;
  TCGv_i64 addr;
  TCGContext_conflict1 *tcg_ctx;
  MemOp opc_local;
  int index_local;
  TCGv_i32 a32_local;
  TCGv_i64 val_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  addr_00 = gen_aa32_addr(s,a32,opc);
  if (((s->uc->mode & UC_MODE_ARMBE8) == UC_MODE_ARM) || (s->sctlr_b == 0)) {
    tcg_gen_qemu_st_i64_aarch64(tcg_ctx_00,val,addr_00,(long)index,opc);
  }
  else {
    ret = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_rotri_i64_aarch64(tcg_ctx_00,ret,val,0x20);
    tcg_gen_qemu_st_i64_aarch64(tcg_ctx_00,ret,addr_00,(long)index,opc);
    tcg_temp_free_i64(tcg_ctx_00,ret);
  }
  tcg_temp_free_i64(tcg_ctx_00,addr_00);
  return;
}

Assistant:

static void gen_aa32_st_i64(DisasContext *s, TCGv_i64 val, TCGv_i32 a32,
                            int index, MemOp opc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr = gen_aa32_addr(s, a32, opc);

    /* Not needed for user-mode BE32, where we use MO_BE instead.  */
    // Unicorn: By default UC_MODE_BIG_MODE is BE32 mode, which in fact qemu-usermode.
    //          Thus, we only do this in BE8 (qemu system) mode.
    if ( (s->uc->mode & UC_MODE_ARMBE8) && s->sctlr_b) {
        TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_rotri_i64(tcg_ctx, tmp, val, 32);
        tcg_gen_qemu_st_i64(tcg_ctx, tmp, addr, index, opc);
        tcg_temp_free_i64(tcg_ctx, tmp);
    } else {
        tcg_gen_qemu_st_i64(tcg_ctx, val, addr, index, opc);
    }
    tcg_temp_free(tcg_ctx, addr);
}